

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O1

char * filter_escapes(char *str)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  char *pcVar7;
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    g_return_if_fail_warning("rifiuti2","filter_escapes","(str != NULL) && (*str != \'\\0\')");
    return (char *)0x0;
  }
  plVar5 = (long *)g_string_new(0);
  do {
    cVar2 = *str;
    if (cVar2 == '\\') {
      pcVar7 = str + 1;
      bVar3 = str[1];
      if (bVar3 < 0x72) {
        if (bVar3 == 0x65) {
          lVar4 = plVar5[1];
          uVar1 = lVar4 + 1;
          if (uVar1 < (ulong)plVar5[2]) {
            plVar5[1] = uVar1;
            *(undefined1 *)(*plVar5 + lVar4) = 0x1b;
LAB_00106880:
            *(undefined1 *)(*plVar5 + plVar5[1]) = 0;
            goto LAB_001068e8;
          }
          uVar9 = 0x1b;
        }
        else {
          if (bVar3 != 0x6e) {
LAB_00106831:
            lVar4 = plVar5[1];
            uVar1 = lVar4 + 1;
            if ((ulong)plVar5[2] <= uVar1) {
              iVar8 = 0x5c;
              goto LAB_00106827;
            }
            plVar5[1] = uVar1;
            *(undefined1 *)(*plVar5 + lVar4) = 0x5c;
            goto LAB_001067e1;
          }
          lVar4 = plVar5[1];
          uVar1 = lVar4 + 1;
          if (uVar1 < (ulong)plVar5[2]) {
            plVar5[1] = uVar1;
            *(undefined1 *)(*plVar5 + lVar4) = 10;
            goto LAB_00106880;
          }
          uVar9 = 10;
        }
      }
      else if (bVar3 == 0x74) {
        lVar4 = plVar5[1];
        uVar1 = lVar4 + 1;
        if (uVar1 < (ulong)plVar5[2]) {
          plVar5[1] = uVar1;
          *(undefined1 *)(*plVar5 + lVar4) = 9;
          goto LAB_00106880;
        }
        uVar9 = 9;
      }
      else {
        if (bVar3 != 0x72) goto LAB_00106831;
        lVar4 = plVar5[1];
        uVar1 = lVar4 + 1;
        if (uVar1 < (ulong)plVar5[2]) {
          plVar5[1] = uVar1;
          *(undefined1 *)(*plVar5 + lVar4) = 0xd;
          goto LAB_00106880;
        }
        uVar9 = 0xd;
      }
      g_string_insert_c(plVar5,0xffffffffffffffff,uVar9);
    }
    else {
      lVar4 = plVar5[1];
      uVar1 = lVar4 + 1;
      if (uVar1 < (ulong)plVar5[2]) {
        plVar5[1] = uVar1;
        *(char *)(*plVar5 + lVar4) = cVar2;
LAB_001067e1:
        *(undefined1 *)(*plVar5 + plVar5[1]) = 0;
        pcVar7 = str;
      }
      else {
        iVar8 = (int)cVar2;
LAB_00106827:
        g_string_insert_c(plVar5,0xffffffffffffffff,iVar8);
        pcVar7 = str;
      }
    }
LAB_001068e8:
    str = pcVar7 + 1;
    if (pcVar7[1] == '\0') {
      plVar6 = (long *)g_string_new("filtered delimiter = ");
      pcVar7 = (char *)*plVar5;
      do {
        pcVar10 = pcVar7 + 1;
        cVar2 = *pcVar7;
        if ((byte)(cVar2 + 0x81U) < 0xa1) {
          g_string_append_printf(plVar6,"\\x%02X",cVar2);
        }
        else {
          lVar4 = plVar6[1];
          uVar1 = lVar4 + 1;
          if (uVar1 < (ulong)plVar6[2]) {
            plVar6[1] = uVar1;
            *(char *)(*plVar6 + lVar4) = cVar2;
            *(undefined1 *)(*plVar6 + plVar6[1]) = 0;
          }
          else {
            g_string_insert_c(plVar6,0xffffffffffffffff,(int)cVar2);
          }
        }
        pcVar7 = pcVar10;
      } while (*pcVar10 != '\0');
      g_log("rifiuti2",0x80,"%s",*plVar6);
      g_string_free(plVar6,1);
      pcVar7 = (char *)g_string_free(plVar5,0);
      return pcVar7;
    }
  } while( true );
}

Assistant:

char *
filter_escapes (const char *str)
{
    GString *result, *debug_str;
    char *i = (char *) str;

    g_return_val_if_fail ( (str != NULL) && (*str != '\0'), NULL);

    result = g_string_new (NULL);
    do
    {
        if ( *i != '\\' )
        {
            result = g_string_append_c (result, *i);
            continue;
        }

        switch ( *(++i) )
        {
          case 'r':
            result = g_string_append_c (result, '\r'); break;
          case 'n':
            result = g_string_append_c (result, '\n'); break;
          case 't':
            result = g_string_append_c (result, '\t'); break;
          case 'e':
            result = g_string_append_c (result, '\x1B'); break;
          default:
            result = g_string_append_c (result, '\\'); i--;
        }
    }
    while ( *(++i) );

    debug_str = g_string_new ("filtered delimiter = ");
    i = result->str;
    do
    {
        if ( *i >= 0x20 && *i <= 0x7E )  /* problem during linking with g_ascii_isprint */
            debug_str = g_string_append_c (debug_str, *i);
        else
            g_string_append_printf (debug_str, "\\x%02X", *(unsigned char *) i);
    }
    while ( *(++i) );
    g_debug ("%s", debug_str->str);
    g_string_free (debug_str, TRUE);
    return g_string_free (result, FALSE);
}